

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void * ufmt_getObject_63(UFormattable *fmt,UErrorCode *status)

{
  UBool UVar1;
  Type TVar2;
  Formattable *this;
  UObject *pUVar3;
  void *ret;
  Formattable *obj;
  UErrorCode *status_local;
  UFormattable *fmt_local;
  
  this = icu_63::Formattable::fromUFormattable(fmt);
  pUVar3 = icu_63::Formattable::getObject(this);
  if (pUVar3 == (UObject *)0x0) {
    TVar2 = icu_63::Formattable::getType(this);
    if (TVar2 != kObject) {
      UVar1 = U_SUCCESS(*status);
      if (UVar1 != '\0') {
        *status = U_INVALID_FORMAT_ERROR;
      }
    }
  }
  return pUVar3;
}

Assistant:

U_DRAFT const void *U_EXPORT2
ufmt_getObject(const UFormattable *fmt, UErrorCode *status) {
  const Formattable *obj = Formattable::fromUFormattable(fmt);

  const void *ret = obj->getObject();
  if( ret==NULL &&
      (obj->getType() != Formattable::kObject) &&
      U_SUCCESS( *status )) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  return ret;
}